

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GridAxisIrregular.cpp
# Opt level: O3

void __thiscall
KDIS::DATA_TYPE::GridAxisIrregular::GridAxisIrregular(GridAxisIrregular *this,KDataStream *stream)

{
  GridAxisRegular::GridAxisRegular(&this->super_GridAxisRegular);
  (this->super_GridAxisRegular).super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__GridAxisIrregular_00224438;
  (this->m_vXiValues).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_vXiValues).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_vXiValues).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_vui16Padding).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_vui16Padding).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_vui16Padding).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Decode(this,stream);
  return;
}

Assistant:

GridAxisIrregular::GridAxisIrregular(KDataStream &stream) noexcept(false)
{
    Decode( stream );
}